

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O0

Vector __thiscall Vector::operator/(Vector *this,float f)

{
  float x;
  float y;
  float z;
  float f_local;
  Vector *this_local;
  Vector vec;
  
  x = X(this);
  y = Y(this);
  z = Z(this);
  Vector((Vector *)&this_local,x,y,z);
  Scale((Vector *)&this_local,1.0 / f);
  return _this_local;
}

Assistant:

Vector Vector::operator/ (float f)
{
   Vector vec(X(), Y(), Z());

   vec.Scale(1.f / f);

   return vec;
}